

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void __thiscall fmt::v8::detail::print(detail *this,FILE *f,string_view text)

{
  char *pcVar1;
  undefined8 uVar2;
  uint *puVar3;
  format_string<> fmt;
  
  pcVar1 = (char *)fwrite(f,1,(size_t)text.data_,(FILE *)this);
  if (text.data_ <= pcVar1) {
    return;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  puVar3 = (uint *)__errno_location();
  fmt.str_.data_ = (char *)(ulong)*puVar3;
  fmt.str_.size_ = (size_t)"cannot write to file";
  system_error<>((int)uVar2,fmt);
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

FMT_FUNC void print(std::FILE* f, string_view text) {
#ifdef _WIN32
  auto fd = _fileno(f);
  if (_isatty(fd)) {
    detail::utf8_to_utf16 u16(string_view(text.data(), text.size()));
    auto written = detail::dword();
    if (detail::WriteConsoleW(reinterpret_cast<void*>(_get_osfhandle(fd)),
                              u16.c_str(), static_cast<uint32_t>(u16.size()),
                              &written, nullptr)) {
      return;
    }
    // Fallback to fwrite on failure. It can happen if the output has been
    // redirected to NUL.
  }
#endif
  detail::fwrite_fully(text.data(), 1, text.size(), f);
}